

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamtests.cc
# Opt level: O0

ktx_error_code_e anon_unknown.dwarf_59e0::StreambufStream::skip(ktxStream *str,ktx_size_t count)

{
  ostream *poVar1;
  pointer pbVar2;
  streamoff sVar3;
  streamoff sVar4;
  ulong in_RSI;
  ktxStream *in_RDI;
  streampos newpos;
  streampos curpos;
  StreambufStream *self;
  fpos local_40 [16];
  fpos local_30 [16];
  StreambufStream *local_20;
  ulong local_18;
  ktx_error_code_e local_4;
  
  local_18 = in_RSI;
  local_20 = parent(in_RDI);
  if (local_18 == 0) {
    local_4 = KTX_SUCCESS;
  }
  else {
    poVar1 = std::operator<<((ostream *)&std::cerr,"\t  skip: ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_18);
    poVar1 = std::operator<<(poVar1,'B');
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    pbVar2 = std::
             unique_ptr<std::basic_streambuf<char,_std::char_traits<char>_>,_std::default_delete<std::basic_streambuf<char,_std::char_traits<char>_>_>_>
             ::operator->((unique_ptr<std::basic_streambuf<char,_std::char_traits<char>_>,_std::default_delete<std::basic_streambuf<char,_std::char_traits<char>_>_>_>
                           *)0x10d8dc);
    local_30 = (fpos  [16])std::streambuf::pubseekoff((long)pbVar2,_S_beg,_S_app);
    pbVar2 = std::
             unique_ptr<std::basic_streambuf<char,_std::char_traits<char>_>,_std::default_delete<std::basic_streambuf<char,_std::char_traits<char>_>_>_>
             ::operator->((unique_ptr<std::basic_streambuf<char,_std::char_traits<char>_>,_std::default_delete<std::basic_streambuf<char,_std::char_traits<char>_>_>_>
                           *)0x10d90d);
    local_40 = (fpos  [16])std::streambuf::pubseekoff((long)pbVar2,(_Ios_Seekdir)local_18,_S_app);
    sVar3 = std::fpos::operator_cast_to_long(local_30);
    sVar4 = std::fpos::operator_cast_to_long(local_40);
    local_4 = KTX_FILE_SEEK_ERROR;
    if (sVar4 < sVar3) {
      local_4 = KTX_SUCCESS;
    }
  }
  return local_4;
}

Assistant:

static KTX_error_code skip(ktxStream* str, ktx_size_t count)
    {
        auto self = parent(str);
        if (count == 0)
        {
            return KTX_SUCCESS;
        }
        std::cerr << "\t  skip: " << count << 'B' << std::endl;

        const std::streampos curpos = self->_streambuf->pubseekoff(0, std::ios::cur, self->_seek_mode);
        const std::streampos newpos = self->_streambuf->pubseekoff(std::streamoff(count), std::ios::cur, self->_seek_mode);
        return (curpos > newpos) ? KTX_SUCCESS : KTX_FILE_SEEK_ERROR;
    }